

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O2

string * lest::make_string<void>(string *__return_storage_ptr__,void *ptr)

{
  uint *puVar1;
  ostream *poVar2;
  ostringstream os;
  undefined8 uStack_180;
  uint auStack_178 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  *(uint *)((long)auStack_178 + *(long *)(_os + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(_os + -0x18)) & 0xffffff4f | 0x10;
  *(uint *)((long)auStack_178 + *(long *)(_os + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(_os + -0x18)) & 0xffffffb5 | 8;
  puVar1 = (uint *)((long)auStack_178 + *(long *)(_os + -0x18));
  *puVar1 = *puVar1 | 0x200;
  *(undefined8 *)((long)&uStack_180 + *(long *)(_os + -0x18)) = 0x12;
  poVar2 = std::operator<<((ostringstream *)&os,0x30);
  std::ostream::_M_insert<long>((long)poVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  return __return_storage_ptr__;
}

Assistant:

inline std::string make_string( T const * ptr )
{
    // Note showbase affects the behavior of /integer/ output;
    std::ostringstream os;
    os << std::internal << std::hex << std::showbase << std::setw( 2 + 2 * sizeof(T*) ) << std::setfill('0') << reinterpret_cast<std::ptrdiff_t>( ptr );
    return os.str();
}